

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_config_matches(ssl_primary_config *data,ssl_primary_config *needle)

{
  _Bool _Var1;
  int iVar2;
  ssl_primary_config *needle_local;
  ssl_primary_config *data_local;
  
  if (((((data->version == needle->version) && (data->version_max == needle->version_max)) &&
       ((data->field_0x60 & 1) == (needle->field_0x60 & 1))) &&
      (((((byte)data->field_0x60 >> 1 & 1) == ((byte)needle->field_0x60 >> 1 & 1) &&
        (((byte)data->field_0x60 >> 2 & 1) == ((byte)needle->field_0x60 >> 2 & 1))) &&
       ((_Var1 = blobcmp(data->cert_blob,needle->cert_blob), _Var1 &&
        ((iVar2 = Curl_safe_strcasecompare(data->CApath,needle->CApath), iVar2 != 0 &&
         (iVar2 = Curl_safe_strcasecompare(data->CAfile,needle->CAfile), iVar2 != 0)))))))) &&
     ((iVar2 = Curl_safe_strcasecompare(data->clientcert,needle->clientcert), iVar2 != 0 &&
      (((((iVar2 = Curl_safe_strcasecompare(data->random_file,needle->random_file), iVar2 != 0 &&
          (iVar2 = Curl_safe_strcasecompare(data->egdsocket,needle->egdsocket), iVar2 != 0)) &&
         (iVar2 = Curl_safe_strcasecompare(data->cipher_list,needle->cipher_list), iVar2 != 0)) &&
        ((iVar2 = Curl_safe_strcasecompare(data->cipher_list13,needle->cipher_list13), iVar2 != 0 &&
         (iVar2 = Curl_safe_strcasecompare(data->curves,needle->curves), iVar2 != 0)))) &&
       (iVar2 = Curl_safe_strcasecompare(data->pinned_key,needle->pinned_key), iVar2 != 0)))))) {
    data_local._7_1_ = true;
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_primary_config *data,
                        struct ssl_primary_config *needle)
{
  if((data->version == needle->version) &&
     (data->version_max == needle->version_max) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     (data->verifystatus == needle->verifystatus) &&
     blobcmp(data->cert_blob, needle->cert_blob) &&
     Curl_safe_strcasecompare(data->CApath, needle->CApath) &&
     Curl_safe_strcasecompare(data->CAfile, needle->CAfile) &&
     Curl_safe_strcasecompare(data->clientcert, needle->clientcert) &&
     Curl_safe_strcasecompare(data->random_file, needle->random_file) &&
     Curl_safe_strcasecompare(data->egdsocket, needle->egdsocket) &&
     Curl_safe_strcasecompare(data->cipher_list, needle->cipher_list) &&
     Curl_safe_strcasecompare(data->cipher_list13, needle->cipher_list13) &&
     Curl_safe_strcasecompare(data->curves, needle->curves) &&
     Curl_safe_strcasecompare(data->pinned_key, needle->pinned_key))
    return TRUE;

  return FALSE;
}